

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O1

void __thiscall cppcms::filters::to_title::operator()(to_title *this,ostream *out)

{
  converter<char> *pcVar1;
  steal_buffer<128UL> sb;
  locale alStack_128 [8];
  char *local_120;
  long local_118;
  char local_110 [16];
  steal_buffer<128UL> local_100;
  
  util::steal_buffer<128UL>::steal_buffer(&local_100,out);
  (*(this->obj_).to_stream_)(out,(this->obj_).ptr_);
  if ((local_100.stream_ != (ostream *)0x0) && (local_100.stolen_ != (streambuf *)0x0)) {
    std::ios::rdbuf((streambuf *)(local_100.stream_ + *(long *)(*(long *)local_100.stream_ + -0x18))
                   );
  }
  local_100.stolen_ = (streambuf *)0x0;
  local_100.stream_ = (ostream *)0x0;
  std::locale::locale(alStack_128,(locale *)(out + *(long *)(*(long *)out + -0x18) + 0xd0));
  pcVar1 = std::use_facet<booster::locale::converter<char>>(alStack_128);
  (**(code **)(*(long *)pcVar1 + 0x10))
            (&local_120,pcVar1,4,local_100.super_stackbuf<128UL>._32_8_,
             local_100.super_stackbuf<128UL>._40_8_,0);
  std::__ostream_insert<char,std::char_traits<char>>(out,local_120,local_118);
  if (local_120 != local_110) {
    operator_delete(local_120);
  }
  std::locale::~locale(alStack_128);
  util::steal_buffer<128UL>::~steal_buffer(&local_100);
  return;
}

Assistant:

void to_title::operator()(std::ostream &out) const
	{
		util::steal_buffer<> sb(out);
		obj_(out);
		sb.release();
		out << ::cppcms::locale::to_title( sb.begin(),sb.end(),out.getloc());
	}